

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int archive_read_format_7zip_read_header(archive_read *a,archive_entry *entry)

{
  long lVar1;
  long lVar2;
  int iVar3;
  wchar_t wVar4;
  undefined8 uVar5;
  archive_string_conv *paVar6;
  ulong *puVar7;
  int *piVar8;
  char *pcVar9;
  archive_entry *in_RSI;
  archive_entry *in_RDI;
  bool bVar10;
  int64_t offset;
  size_t size;
  uchar *mem;
  void *buff;
  size_t symsize;
  uchar *symname;
  _7z_header_info header;
  uint64_t fidx;
  _7z_folder *folder;
  int ret;
  int r;
  _7zip_entry *zip_entry;
  _7zip_conflict *zip;
  archive_string_conv *in_stack_ffffffffffffff48;
  archive_entry *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  size_t *in_stack_ffffffffffffff68;
  void **in_stack_ffffffffffffff70;
  archive_read *in_stack_ffffffffffffff78;
  void *local_80;
  _7z_header_info *in_stack_ffffffffffffff88;
  long lVar11;
  _7zip_conflict *in_stack_ffffffffffffff90;
  archive_read *__ptr;
  archive_read *in_stack_ffffffffffffff98;
  ulong local_40;
  int local_30;
  int local_4;
  
  lVar1 = *(long *)in_RDI[2].ae_fflags_text.aes_mbs.buffer_length;
  local_30 = 0;
  if (*(int *)(lVar1 + 0x50a0) == -1) {
    *(undefined4 *)(lVar1 + 0x50a0) = 0;
  }
  in_RDI->stat_valid = L'\x000e0000';
  if ((char *)(in_RDI->ae_stat).aest_atime == (char *)0x0) {
    (in_RDI->ae_stat).aest_atime = (int64_t)"7-Zip";
  }
  if (*(long *)(lVar1 + 0xa0) == 0) {
    memset(&stack0xffffffffffffff98,0,0x28);
    iVar3 = slurp_central_directory
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                      );
    free_Header((_7z_header_info *)0x1a7747);
    if (iVar3 != 0) {
      return iVar3;
    }
    *(undefined8 *)(lVar1 + 0x90) = *(undefined8 *)(lVar1 + 0x98);
    *(undefined8 *)(lVar1 + 0xa8) = *(undefined8 *)(lVar1 + 0xa0);
  }
  else {
    *(long *)(lVar1 + 0xa8) = *(long *)(lVar1 + 0xa8) + 0x58;
  }
  lVar2 = *(long *)(lVar1 + 0xa8);
  if (*(long *)(lVar1 + 0x90) == 0) {
    local_4 = 1;
  }
  else {
    *(long *)(lVar1 + 0x90) = *(long *)(lVar1 + 0x90) + -1;
    *(undefined8 *)(lVar1 + 0xb8) = 0;
    *(undefined1 *)(lVar1 + 0xd0) = 0;
    uVar5 = crc32(0,0,0);
    *(undefined8 *)(lVar1 + 200) = uVar5;
    if (*(long *)(lVar1 + 0x5058) == 0) {
      paVar6 = archive_string_conversion_from_charset
                         ((archive *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff58,
                          (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      *(archive_string_conv **)(lVar1 + 0x5058) = paVar6;
      if (*(long *)(lVar1 + 0x5058) == 0) {
        return -0x1e;
      }
    }
    if ((lVar2 != 0) && ((ulong)*(uint *)(lVar2 + 0x10) < *(ulong *)(lVar1 + 0x30))) {
      puVar7 = (ulong *)(*(long *)(lVar1 + 0x38) + (ulong)*(uint *)(lVar2 + 0x10) * 0x68);
      local_40 = 0;
      while( true ) {
        bVar10 = false;
        if (puVar7 != (ulong *)0x0) {
          bVar10 = local_40 < *puVar7;
        }
        if (!bVar10) break;
        in_stack_ffffffffffffff58 = *(char **)(puVar7[1] + local_40 * 0x28);
        if (((in_stack_ffffffffffffff58 == (char *)0x6f10101) ||
            (in_stack_ffffffffffffff58 == (char *)0x6f10303)) ||
           (in_stack_ffffffffffffff58 == (char *)0x6f10701)) {
          archive_entry_set_is_data_encrypted(in_RSI,'\x01');
          *(undefined4 *)(lVar1 + 0x50a0) = 1;
        }
        local_40 = local_40 + 1;
      }
      in_stack_ffffffffffffff67 = 0;
    }
    if (*(int *)(lVar1 + 0x50a0) == -1) {
      *(undefined4 *)(lVar1 + 0x50a0) = 0;
    }
    wVar4 = _archive_entry_copy_pathname_l
                      ((archive_entry *)
                       CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50,
                       in_stack_ffffffffffffff48);
    if (wVar4 != L'\0') {
      piVar8 = __errno_location();
      if (*piVar8 == 0xc) {
        archive_set_error((archive *)in_RDI,0xc,"Can\'t allocate memory for Pathname");
        return -0x1e;
      }
      in_stack_ffffffffffffff50 = in_RDI;
      pcVar9 = archive_string_conversion_charset_name(*(archive_string_conv **)(lVar1 + 0x5058));
      archive_set_error((archive *)in_stack_ffffffffffffff50,0x54,
                        "Pathname cannot be converted from %s to current locale.",pcVar9);
      local_30 = -0x14;
    }
    archive_entry_set_mode(in_RSI,*(mode_t *)(lVar2 + 0x50));
    if ((*(uint *)(lVar2 + 0x18) & 1) != 0) {
      archive_entry_set_mtime(in_RSI,*(time_t *)(lVar2 + 0x20),*(long *)(lVar2 + 0x38));
    }
    if ((*(uint *)(lVar2 + 0x18) & 4) != 0) {
      archive_entry_set_ctime(in_RSI,*(time_t *)(lVar2 + 0x30),*(long *)(lVar2 + 0x48));
    }
    if ((*(uint *)(lVar2 + 0x18) & 2) != 0) {
      archive_entry_set_atime(in_RSI,*(time_t *)(lVar2 + 0x28),*(long *)(lVar2 + 0x40));
    }
    if (*(int *)(lVar2 + 0x14) == -1) {
      *(undefined8 *)(lVar1 + 0xc0) = 0;
      archive_entry_set_size(in_RSI,0);
    }
    else {
      *(undefined8 *)(lVar1 + 0xc0) =
           *(undefined8 *)(*(long *)(lVar1 + 0x50) + (ulong)*(uint *)(lVar2 + 0x14) * 8);
      archive_entry_set_size(in_RSI,*(int64_t *)(lVar1 + 0xc0));
    }
    if (*(long *)(lVar1 + 0xc0) == 0) {
      *(undefined1 *)(lVar1 + 0xd0) = 1;
    }
    if ((*(uint *)(lVar2 + 0x50) & 0xf000) == 0xa000) {
      __ptr = (archive_read *)0x0;
      lVar11 = 0;
      while (*(long *)(lVar1 + 0xc0) != 0) {
        iVar3 = archive_read_format_7zip_read_data
                          (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68,
                           (int64_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60))
        ;
        if (iVar3 < -0x14) {
          free(__ptr);
          return iVar3;
        }
        in_stack_ffffffffffffff78 =
             (archive_read *)realloc(__ptr,(long)in_stack_ffffffffffffff70 + lVar11 + 1);
        if (in_stack_ffffffffffffff78 == (archive_read *)0x0) {
          free(__ptr);
          archive_set_error((archive *)in_RDI,0xc,"Can\'t allocate memory for Symname");
          return -0x1e;
        }
        __ptr = in_stack_ffffffffffffff78;
        memcpy((void *)((long)&(in_stack_ffffffffffffff78->archive).magic + lVar11),local_80,
               (size_t)in_stack_ffffffffffffff70);
        lVar11 = (long)in_stack_ffffffffffffff70 + lVar11;
      }
      if (lVar11 == 0) {
        *(uint *)(lVar2 + 0x50) = *(uint *)(lVar2 + 0x50) & 0xffff0fff;
        *(uint *)(lVar2 + 0x50) = *(uint *)(lVar2 + 0x50) | 0x8000;
        archive_entry_set_mode(in_RSI,*(mode_t *)(lVar2 + 0x50));
      }
      else {
        *(undefined1 *)((long)&(__ptr->archive).magic + lVar11) = 0;
        archive_entry_copy_symlink(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
      }
      free(__ptr);
      archive_entry_set_size(in_RSI,0);
    }
    sprintf((char *)(lVar1 + 0x5060),"7-Zip");
    (in_RDI->ae_stat).aest_atime = (int64_t)(lVar1 + 0x5060);
    local_4 = local_30;
  }
  return local_4;
}

Assistant:

static int
archive_read_format_7zip_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	struct _7zip_entry *zip_entry;
	int r, ret = ARCHIVE_OK;
	struct _7z_folder *folder = 0;
	uint64_t fidx = 0;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_7ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "7-Zip";

	if (zip->entries == NULL) {
		struct _7z_header_info header;

		memset(&header, 0, sizeof(header));
		r = slurp_central_directory(a, zip, &header);
		free_Header(&header);
		if (r != ARCHIVE_OK)
			return (r);
		zip->entries_remaining = (size_t)zip->numFiles;
		zip->entry = zip->entries;
	} else {
		++zip->entry;
	}
	zip_entry = zip->entry;

	if (zip->entries_remaining <= 0)
		return ARCHIVE_EOF;
	--zip->entries_remaining;

	zip->entry_offset = 0;
	zip->end_of_entry = 0;
	zip->entry_crc32 = crc32(0, NULL, 0);

	/* Setup a string conversion for a filename. */
	if (zip->sconv == NULL) {
		zip->sconv = archive_string_conversion_from_charset(
		    &a->archive, "UTF-16LE", 1);
		if (zip->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	/* Figure out if the entry is encrypted by looking at the folder
	   that is associated to the current 7zip entry. If the folder
	   has a coder with a _7Z_CRYPTO codec then the folder is encrypted.
	   Hence the entry must also be encrypted. */
	if (zip_entry && zip_entry->folderIndex < zip->si.ci.numFolders) {
		folder = &(zip->si.ci.folders[zip_entry->folderIndex]);
		for (fidx=0; folder && fidx<folder->numCoders; fidx++) {
			switch(folder->coders[fidx].codec) {
				case _7Z_CRYPTO_MAIN_ZIP:
				case _7Z_CRYPTO_RAR_29:
				case _7Z_CRYPTO_AES_256_SHA_256: {
					archive_entry_set_is_data_encrypted(entry, 1);
					zip->has_encrypted_entries = 1;
					break;
				}
			}
		}
	}

	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (archive_entry_copy_pathname_l(entry,
	    (const char *)zip_entry->utf16name,
	    zip_entry->name_len, zip->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(zip->sconv));
		ret = ARCHIVE_WARN;
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	if (zip_entry->flg & MTIME_IS_SET)
		archive_entry_set_mtime(entry, zip_entry->mtime,
			zip_entry->mtime_ns);
	if (zip_entry->flg & CTIME_IS_SET)
		archive_entry_set_ctime(entry, zip_entry->ctime,
		    zip_entry->ctime_ns);
	if (zip_entry->flg & ATIME_IS_SET)
		archive_entry_set_atime(entry, zip_entry->atime,
		    zip_entry->atime_ns);
	if (zip_entry->ssIndex != (uint32_t)-1) {
		zip->entry_bytes_remaining =
		    zip->si.ss.unpackSizes[zip_entry->ssIndex];
		archive_entry_set_size(entry, zip->entry_bytes_remaining);
	} else {
		zip->entry_bytes_remaining = 0;
		archive_entry_set_size(entry, 0);
	}

	/* If there's no body, force read_data() to return EOF immediately. */
	if (zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	if ((zip_entry->mode & AE_IFMT) == AE_IFLNK) {
		unsigned char *symname = NULL;
		size_t symsize = 0;

		/*
		 * Symbolic-name is recorded as its contents. We have to
		 * read the contents at this time.
		 */
		while (zip->entry_bytes_remaining > 0) {
			const void *buff;
			unsigned char *mem;
			size_t size;
			int64_t offset;

			r = archive_read_format_7zip_read_data(a, &buff,
				&size, &offset);
			if (r < ARCHIVE_WARN) {
				free(symname);
				return (r);
			}
			mem = realloc(symname, symsize + size + 1);
			if (mem == NULL) {
				free(symname);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symname");
				return (ARCHIVE_FATAL);
			}
			symname = mem;
			memcpy(symname+symsize, buff, size);
			symsize += size;
		}
		if (symsize == 0) {
			/* If there is no synname, handle it as a regular
			 * file. */
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFREG;
			archive_entry_set_mode(entry, zip_entry->mode);
		} else {
			symname[symsize] = '\0';
			archive_entry_copy_symlink(entry,
			    (const char *)symname);
		}
		free(symname);
		archive_entry_set_size(entry, 0);
	}

	/* Set up a more descriptive format name. */
	sprintf(zip->format_name, "7-Zip");
	a->archive.archive_format_name = zip->format_name;

	return (ret);
}